

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O2

void __thiscall QPDFObjectHandle::removeKey(QPDFObjectHandle *this,string *key)

{
  Dictionary dict;
  allocator<char> local_39;
  string local_38;
  
  as_dictionary((QPDFObjectHandle *)&local_38,(typed)this);
  if (local_38._M_dataplus._M_p == (pointer)0x0) {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"ignoring key removal request",&local_39);
    typeWarning(this,"dictionary",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    ::qpdf::BaseDictionary::removeKey((BaseDictionary *)&local_38,key);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::removeKey(std::string const& key)
{
    if (auto dict = as_dictionary(strict)) {
        dict.removeKey(key);
        return;
    }
    typeWarning("dictionary", "ignoring key removal request");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary ignoring removeKey");
}